

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsumst.hpp
# Opt level: O2

void __thiscall
soplex::SPxSumST<double>::setupWeights(SPxSumST<double> *this,SPxSolverBase<double> *base)

{
  uint uVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  double local_c8;
  pointer local_c0;
  VectorBase<double> delta;
  VectorBase<double> work;
  VectorBase<double> rowLen;
  
  work.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  delta.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  work.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  work.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  delta.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  delta.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  rowLen.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  rowLen.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  rowLen.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  VectorBase<double>::reDim
            (&rowLen,(base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                     super_SVSetBase<double>.set.thenum,true);
  VectorBase<double>::reDim
            (&work,(base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                   super_SVSetBase<double>.set.thenum,true);
  VectorBase<double>::reDim
            (&delta,(base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                    super_SVSetBase<double>.set.thenum,true);
  pdVar6 = work.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar3 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar4 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar5 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  uVar1 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
          thenum;
  local_c0 = pdVar3 + ((ulong)uVar1 - 1);
  for (lVar9 = 0; 0 < (int)(uVar1 + (int)lVar9); lVar9 = lVar9 + -1) {
    dVar10 = SVectorBase<double>::length2
                       ((SVectorBase<double> *)
                        ((base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                         super_SVSetBase<double>.set.theitem +
                        (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                        super_SVSetBase<double>.set.thekey[(ulong)uVar1 + lVar9 + -1].idx));
    rowLen.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[(ulong)uVar1 + lVar9 + -1] = dVar10;
    dVar11 = pdVar2[(ulong)uVar1 + lVar9 + -1];
    if ((0.0 < dVar11) || (dVar11 = local_c0[lVar9], dVar11 < 0.0)) {
      local_c8 = dVar11 / dVar10;
      VectorBase<double>::multAdd<double,double>
                (&delta,&local_c8,
                 (SVectorBase<double> *)
                 ((base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>
                  .set.theitem +
                 (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
                 set.thekey[(ulong)uVar1 + lVar9 + -1].idx));
    }
  }
  iVar8 = 0;
  while( true ) {
    VectorBase<double>::operator+=(&work,&delta);
    for (uVar7 = (ulong)(uint)(base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                              super_SVSetBase<double>.set.thenum; 0 < (int)uVar7; uVar7 = uVar7 - 1)
    {
      dVar11 = pdVar4[uVar7 - 1];
      dVar10 = pdVar6[uVar7 - 1];
      if (dVar11 < pdVar6[uVar7 - 1]) {
        pdVar6[uVar7 - 1] = dVar11;
        dVar10 = dVar11;
      }
      dVar11 = pdVar5[uVar7 - 1];
      if (dVar10 < dVar11) {
        pdVar6[uVar7 - 1] = dVar11;
      }
    }
    if (iVar8 == 0xc) break;
    VectorBase<double>::clear(&delta);
    uVar1 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
            thenum;
    local_c0 = pdVar3 + ((ulong)uVar1 - 1);
    for (lVar9 = 0; 0 < (int)(uVar1 + (int)lVar9); lVar9 = lVar9 + -1) {
      dVar10 = SVectorBase<double>::operator*
                         ((SVectorBase<double> *)
                          ((base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                           super_SVSetBase<double>.set.theitem +
                          (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                          super_SVSetBase<double>.set.thekey[(ulong)uVar1 + lVar9 + -1].idx),&work);
      dVar11 = pdVar2[(ulong)uVar1 + lVar9 + -1];
      if ((dVar10 < dVar11) || (dVar11 = local_c0[lVar9], dVar11 < dVar10)) {
        local_c8 = (dVar11 - dVar10) /
                   rowLen.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[(ulong)uVar1 + lVar9 + -1];
        VectorBase<double>::multAdd<double,double>
                  (&delta,&local_c8,
                   (SVectorBase<double> *)
                   ((base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                    super_SVSetBase<double>.set.theitem +
                   (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                   super_SVSetBase<double>.set.thekey[(ulong)uVar1 + lVar9 + -1].idx));
      }
    }
    iVar8 = iVar8 + 1;
  }
  SPxVectorST<double>::primal(&this->super_SPxVectorST<double>,&work);
  SPxVectorST<double>::setupWeights(&this->super_SPxVectorST<double>,base);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&rowLen);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&delta);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&work);
  return;
}

Assistant:

void SPxSumST<R>::setupWeights(SPxSolverBase<R>& base)
{
   int count;
   int i;
   R x;
   VectorBase<R> work, delta, rowLen;

   assert(base.nRows() > 0);
   assert(base.nCols() > 0);

   rowLen.reDim(base.nRows(), true);
   work.reDim(base.nCols(), true);
   delta.reDim(base.nCols(), true);

   R* wrk = work.get_ptr();
   const R* lhs = base.lhs().get_const_ptr();
   const R* rhs = base.rhs().get_const_ptr();
   const R* up = base.upper().get_const_ptr();
   const R* low = base.lower().get_const_ptr();

   for(i = base.nRows(); --i >= 0;)
   {
      rowLen[i] = base.rowVector(i).length2();

      if(lhs[i] > 0)
         delta.multAdd(lhs[i] / rowLen[i], base.rowVector(i));
      else if(rhs[i] < 0)
         delta.multAdd(rhs[i] / rowLen[i], base.rowVector(i));
   }

   for(count = 0;; count++)
   {
      work += delta;

      for(i = base.nCols(); --i >= 0;)
      {
         if(wrk[i] > up[i])
            wrk[i] = up[i];

         if(wrk[i] < low[i])
            wrk[i] = low[i];
      }

      //      std::cout << -(work * base.maxObj()) << std::endl;
      if(count >= 12)
         break;

      delta.clear();

      for(i = base.nRows(); --i >= 0;)
      {
         x = base.rowVector(i) * work;

         if(lhs[i] > x)
            delta.multAdd((lhs[i] - x) / rowLen[i], base.rowVector(i));
         else if(rhs[i] < x)
            delta.multAdd((rhs[i] - x) / rowLen[i], base.rowVector(i));
      }
   }

   this->primal(work);
   SPxVectorST<R>::setupWeights(base);
}